

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1e824c::ValueSetter::handleToken(ValueSetter *this,Token *token)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_41;
  string local_40 [7];
  bool do_replace;
  string value;
  token_type_e ttype;
  Token *token_local;
  ValueSetter *this_local;
  
  value.field_2._12_4_ = QPDFTokenizer::Token::getType(token);
  psVar2 = QPDFTokenizer::Token::getValue_abi_cxx11_(token);
  std::__cxx11::string::string(local_40,(string *)psVar2);
  local_41 = 0;
  switch(this->state) {
  case st_top:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"BMC",&local_79);
    bVar1 = QPDFTokenizer::Token::isWord(token,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    if (bVar1) {
      this->state = st_bmc;
    }
    break;
  case st_bmc:
    if ((value.field_2._12_4_ == 0xf) || (value.field_2._12_4_ == 0x10)) {
      QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    }
    else {
      this->state = st_emc;
    }
  case st_emc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"EMC",&local_a1);
    bVar1 = QPDFTokenizer::Token::isWord(token,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    if (bVar1) {
      local_41 = 1;
      this->state = st_end;
    }
    break;
  case st_end:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
  }
  if ((local_41 & 1) != 0) {
    writeAppearance(this);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
ValueSetter::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e ttype = token.getType();
    std::string value = token.getValue();
    bool do_replace = false;
    switch (state) {
    case st_top:
        writeToken(token);
        if (token.isWord("BMC")) {
            state = st_bmc;
        }
        break;

    case st_bmc:
        if ((ttype == QPDFTokenizer::tt_space) || (ttype == QPDFTokenizer::tt_comment)) {
            writeToken(token);
        } else {
            state = st_emc;
        }
        // fall through to emc

    case st_emc:
        if (token.isWord("EMC")) {
            do_replace = true;
            state = st_end;
        }
        break;

    case st_end:
        writeToken(token);
        break;
    }
    if (do_replace) {
        writeAppearance();
    }
}